

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O0

Msg * __thiscall util::logging::Msg::operator+(Msg *__return_storage_ptr__,Msg *this,longlong val)

{
  boost local_40 [32];
  longlong local_20;
  longlong val_local;
  Msg *this_local;
  
  local_20 = val;
  val_local = (longlong)this;
  this_local = __return_storage_ptr__;
  boost::lexical_cast<std::__cxx11::string,long_long>(local_40,&local_20);
  operator+(__return_storage_ptr__,this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Msg Msg::operator+( long long val )
		{
			return operator+( boost::lexical_cast<std::string>(val) );
		}